

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QPermission *permission)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  QTextStream *pQVar4;
  _func_int **pp_Var5;
  QMetaType QVar6;
  QString *pQVar7;
  storage_type *in_RCX;
  undefined1 *puVar8;
  int *in_RDX;
  char *pcVar9;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebug local_58;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(*(long *)permission + 0x34);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)permission);
  lVar3 = *(long *)permission;
  *(undefined1 *)(lVar3 + 0x30) = 0;
  *(undefined4 *)(lVar3 + 0x34) = 0;
  if (1 < iVar2) {
    QVar6 = QVariant::metaType((QVariant *)(in_RDX + 2));
    if (QVar6.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (QVar6.d_ptr)->name;
    }
    if (pcVar9 == (char *)0x0) {
      this = (QString *)0x0;
    }
    else {
      pQVar7 = (QString *)0xffffffffffffffff;
      do {
        this = (QString *)((long)&(pQVar7->d).d + 1);
        pcVar1 = pcVar9 + 1 + (long)pQVar7;
        pQVar7 = this;
      } while (*pcVar1 != '\0');
    }
    pQVar4 = *(QTextStream **)permission;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)pcVar9;
    QString::fromUtf8(&local_48,this,ba);
    QTextStream::operator<<(pQVar4,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)permission)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)permission,' ');
    }
    pQVar4 = *(QTextStream **)permission;
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)"(";
    QString::fromUtf8(&local_48,(QString *)0x1,ba_00);
    QTextStream::operator<<(pQVar4,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)permission)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)permission,' ');
    }
  }
  local_60.stream = *(Stream **)permission;
  (local_60.stream)->ref = (local_60.stream)->ref + 1;
  puVar8 = Qt::staticMetaObject;
  qt_QMetaEnum_debugOperator
            (&local_58,(qint64)&local_60,(QMetaObject *)(long)*in_RDX,Qt::staticMetaObject);
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  if (1 < iVar2) {
    pQVar4 = *(QTextStream **)permission;
    ba_01.m_data = puVar8;
    ba_01.m_size = (qsizetype)")";
    QString::fromUtf8(&local_48,(QString *)0x1,ba_01);
    QTextStream::operator<<(pQVar4,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)permission)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)permission,' ');
    }
  }
  pp_Var5 = *(_func_int ***)permission;
  *(undefined8 *)permission = 0;
  ((debug.stream)->ts)._vptr_QTextStream = pp_Var5;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QPermission &permission)
{
    const auto verbosity = debug.verbosity();
    QDebugStateSaver saver(debug);
    debug.nospace().setVerbosity(0);
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << permission.type().name() << "(";
    debug << permission.status();
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << ")";
    return debug;
}